

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

type chaiscript::Boxed_Number::go<unsigned_char,double>
               (Opers t_oper,Boxed_Value *t_lhs,Boxed_Value *t_rhs)

{
  bool bVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int in_ESI;
  element_type *in_RDI;
  Boxed_Value BVar4;
  type tVar5;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  element_type *peVar6;
  undefined8 in_stack_ffffffffffffffb8;
  Opers t_oper_00;
  double *in_stack_ffffffffffffffc8;
  double *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  Opers t_oper_01;
  
  t_oper_01 = (Opers)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  t_oper_00 = (Opers)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  peVar6 = in_RDI;
  if ((in_ESI < 1) || (6 < in_ESI)) {
    if ((7 < in_ESI) && (in_ESI < 0xf)) {
      bVar1 = Boxed_Value::is_const((Boxed_Value *)0x1e4a7f);
      if (!bVar1) {
        bVar1 = Boxed_Value::is_return_value((Boxed_Value *)0x1e4a8d);
        if (!bVar1) {
          Boxed_Value::get_ptr((Boxed_Value *)0x1e4aa3);
          get_as_aux<double,double>((Boxed_Value *)0x1e4ab2);
          BVar4 = binary_go<unsigned_char,double>
                            (t_oper_00,(uchar *)peVar6,(double *)in_RDI,
                             (Boxed_Value *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
          _Var3._M_pi = BVar4.m_data.
                        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          goto LAB_001e4b4d;
        }
      }
    }
    if (in_ESI < 0x1f) {
      uVar2 = __cxa_allocate_exception(0x28);
      chaiscript::detail::exception::bad_any_cast::bad_any_cast
                ((bad_any_cast *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      __cxa_throw(uVar2,&chaiscript::detail::exception::bad_any_cast::typeinfo,
                  chaiscript::detail::exception::bad_any_cast::~bad_any_cast);
    }
    get_as_aux<double,unsigned_char>((Boxed_Value *)0x1e4af0);
    get_as_aux<double,double>((Boxed_Value *)0x1e4b00);
    BVar4 = const_binary_go<double>(t_oper_01,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    _Var3._M_pi = BVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    get_as_aux<double,unsigned_char>((Boxed_Value *)0x1e4a34);
    get_as_aux<double,double>((Boxed_Value *)0x1e4a44);
    BVar4 = boolean_go<double>(t_oper_00,(double *)peVar6,(double *)in_RDI);
    _Var3._M_pi = BVar4.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
LAB_001e4b4d:
  tVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  tVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar6;
  return (type)tVar5.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_lhs, const Boxed_Value &t_rhs) 
          -> typename std::enable_if<std::is_floating_point<LHS>::value || std::is_floating_point<RHS>::value, Boxed_Value>::type
      {
        typedef typename std::common_type<LHS, RHS>::type common_type;
        if (t_oper > Operators::boolean_flag && t_oper < Operators::non_const_flag)
        {
          return boolean_go(t_oper, get_as_aux<common_type, LHS>(t_lhs), get_as_aux<common_type, RHS>(t_rhs));
        } else if (t_oper > Operators::non_const_flag && t_oper < Operators::non_const_int_flag && !t_lhs.is_const() && !t_lhs.is_return_value()) {
          return binary_go(t_oper, *static_cast<LHS *>(t_lhs.get_ptr()), get_as_aux<common_type, RHS>(t_rhs), t_lhs);
        } else if (t_oper > Operators::const_flag) {
          return const_binary_go(t_oper, get_as_aux<common_type, LHS>(t_lhs), get_as_aux<common_type, RHS>(t_rhs));
        } else {
          throw chaiscript::detail::exception::bad_any_cast();
        }
      }